

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_aarch64.c
# Opt level: O2

uc_err reg_read_aarch64(void *_env,int mode,uint regid,void *value,size_t *size)

{
  uint32_t uVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  ARMCPRegInfo_conflict *ri;
  uint64_t uVar5;
  uc_err uVar6;
  
  uVar2 = regid - 0x7c;
  if (0x1f < regid - 0xe4) {
    uVar2 = regid;
  }
  if (uVar2 - 199 < 0x1d) {
    if (7 < *size) {
      *size = 8;
      uVar3 = *(undefined8 *)((long)_env + (ulong)(uVar2 - 199) * 8 + 0x40);
      goto LAB_00575ffa;
    }
  }
  else if (uVar2 - 0xa8 < 0x1f) {
    if (3 < *size) {
      *size = 4;
      uVar2 = *(uint *)((long)_env + (ulong)(uVar2 - 0xa8) * 8 + 0x40);
      goto LAB_00576022;
    }
  }
  else if (uVar2 - 0x68 < 0x20) {
    if (0xf < *size) {
      *size = 0x10;
      lVar4 = (ulong)(uVar2 - 0x68) * 0x100;
      *(undefined8 *)value = *(undefined8 *)((long)_env + lVar4 + 0xc10);
      *(undefined8 *)((long)value + 8) = *(undefined8 *)((long)_env + lVar4 + 0xc18);
      return UC_ERR_OK;
    }
  }
  else if (uVar2 - 0x28 < 0x20) {
    if (7 < *size) {
      *size = 8;
      uVar3 = *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x28) * 0x100 + 0xc10);
      goto LAB_00575ffa;
    }
  }
  else if (uVar2 - 0x88 < 0x20) {
    if (3 < *size) {
      *size = 4;
      uVar2 = *(uint *)((long)_env + (ulong)(uVar2 - 0x88) * 0x100 + 0xc10);
      goto LAB_00576022;
    }
  }
  else if (uVar2 - 0x48 < 0x20) {
    if (1 < *size) {
      *size = 2;
      *(undefined2 *)value = *(undefined2 *)((long)_env + (ulong)(uVar2 - 0x48) * 0x100 + 0xc10);
      return UC_ERR_OK;
    }
  }
  else if (uVar2 - 8 < 0x20) {
    if (*size != 0) {
      *size = 1;
      *(undefined1 *)value = *(undefined1 *)((long)_env + (ulong)(uVar2 - 8) * 0x100 + 0xc10);
      return UC_ERR_OK;
    }
  }
  else if (uVar2 - 0x10a < 4) {
    if (7 < *size) {
      *size = 8;
      uVar3 = *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x10a) * 8 + 0x238);
      goto LAB_00575ffa;
    }
  }
  else if (uVar2 - 0x10e < 4) {
    if (7 < *size) {
      *size = 8;
      uVar3 = *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x10e) * 8 + 600);
      goto LAB_00575ffa;
    }
  }
  else if ((uVar2 & 0xfffffffc) == 0x118) {
    if (7 < *size) {
      *size = 8;
      uVar3 = *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x118) * 8 + 0x418);
      goto LAB_00575ffa;
    }
  }
  else if ((uVar2 & 0xfffffffc) == 0x114) {
    if (7 < *size) {
      *size = 8;
      uVar3 = *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x114) * 8 + 0x3d8);
      goto LAB_00575ffa;
    }
  }
  else if (uVar2 - 0x11e < 4) {
    if (7 < *size) {
      *size = 8;
      uVar3 = *(undefined8 *)((long)_env + (ulong)(uVar2 - 0x11e) * 8 + 0x4c0);
      goto LAB_00575ffa;
    }
  }
  else {
    uVar6 = UC_ERR_ARG;
    switch(uVar2) {
    case 0x104:
      if (7 < *size) {
        *size = 8;
        uVar3 = *(undefined8 *)((long)_env + 0x140);
LAB_00575ffa:
        *(undefined8 *)value = uVar3;
        return UC_ERR_OK;
      }
      break;
    case 0x105:
      if (3 < *size) {
        *size = 4;
        uVar2 = *(uint *)((long)_env + 0x2c0);
        goto LAB_00576022;
      }
      break;
    case 0x106:
      if (7 < *size) {
        *size = 8;
        uVar3 = *(undefined8 *)((long)_env + 0x510);
        goto LAB_00575ffa;
      }
      break;
    case 0x107:
      if (7 < *size) {
        *size = 8;
        uVar3 = *(undefined8 *)((long)_env + 0x548);
        goto LAB_00575ffa;
      }
      break;
    case 0x108:
      if (7 < *size) {
        *size = 8;
        uVar3 = *(undefined8 *)((long)_env + 0x518);
        goto LAB_00575ffa;
      }
      break;
    case 0x109:
      if (3 < *size) {
        *size = 4;
        *(uint *)value =
             *(int *)((long)_env + 0x208) << 0x1d |
             (uint)(*(int *)((long)_env + 0x214) == 0) << 0x1e |
             *(uint *)((long)_env + 0x210) & 0x80000000 | *(uint *)((long)_env + 0x148) |
             *(uint *)((long)_env + 0x20c) >> 3 & 0x10000000 | *(uint *)((long)_env + 0x230) |
             *(int *)((long)_env + 0x228) << 10;
        return UC_ERR_OK;
      }
      break;
    case 0x10a:
    case 0x10b:
    case 0x10c:
    case 0x10d:
    case 0x10e:
    case 0x10f:
    case 0x110:
    case 0x111:
      goto switchD_00576221_caseD_11e;
    case 0x112:
      if (7 < *size) {
        *size = 8;
        uVar3 = *(undefined8 *)((long)_env + 0x308);
        goto LAB_00575ffa;
      }
      break;
    case 0x113:
      if (7 < *size) {
        *size = 8;
        uVar3 = *(undefined8 *)((long)_env + 0x328);
        goto LAB_00575ffa;
      }
      break;
    default:
      switch(uVar2) {
      case 0x11c:
        if (7 < *size) {
          *size = 8;
          uVar3 = *(undefined8 *)((long)_env + 0x450);
          goto LAB_00575ffa;
        }
        break;
      case 0x11d:
        if (7 < *size) {
          *size = 8;
          uVar3 = *(undefined8 *)((long)_env + 0x4a8);
          goto LAB_00575ffa;
        }
        break;
      case 0x11e:
      case 0x11f:
      case 0x120:
      case 0x121:
        goto switchD_00576221_caseD_11e;
      case 0x122:
        if (0x1f < *size) {
          *size = 0x20;
          ri = get_arm_cp_reginfo_aarch64
                         (*(GHashTable **)
                           (*(long *)(*(long *)((long)_env + 0x31b8) + 0x1a0) + 0xd510),
                          *(int *)((long)value + 4) << 3 | *value << 7 |
                          *(int *)((long)value + 0xc) << 0xb | *(int *)((long)value + 8) << 0xe |
                          *(uint *)((long)value + 0x10) | 0x10130000);
          if (ri != (ARMCPRegInfo_conflict *)0x0) {
            uVar5 = read_raw_cp_reg_aarch64((CPUARMState_conflict *)_env,ri);
            *(uint64_t *)((long)value + 0x18) = uVar5;
            return UC_ERR_OK;
          }
          return UC_ERR_ARG;
        }
        break;
      case 0x123:
        if (3 < *size) {
          *size = 4;
          uVar1 = vfp_get_fpscr_aarch64((CPUARMState_conflict *)_env);
          uVar2 = uVar1 & 0x7ff9f00;
LAB_00576022:
          *(uint *)value = uVar2;
          return UC_ERR_OK;
        }
        break;
      case 0x124:
        if (3 < *size) {
          *size = 4;
          uVar1 = vfp_get_fpscr_aarch64((CPUARMState_conflict *)_env);
          uVar2 = uVar1 & 0xf800009f;
          goto LAB_00576022;
        }
        break;
      default:
        switch(uVar2) {
        case 1:
          if (7 < *size) {
            *size = 8;
            uVar3 = *(undefined8 *)((long)_env + 0x128);
            goto LAB_00575ffa;
          }
          break;
        case 2:
          if (7 < *size) {
            *size = 8;
            uVar3 = *(undefined8 *)((long)_env + 0x130);
            goto LAB_00575ffa;
          }
          break;
        case 3:
          if (3 < *size) {
            *size = 4;
            uVar1 = cpsr_read_aarch64((CPUARMState_conflict *)_env);
            uVar2 = uVar1 & 0xf0000000;
            goto LAB_00576022;
          }
          break;
        case 4:
          if (7 < *size) {
            *size = 8;
            uVar3 = *(undefined8 *)((long)_env + 0x138);
            goto LAB_00575ffa;
          }
          break;
        default:
          goto switchD_00576221_caseD_11e;
        }
      }
    }
  }
  uVar6 = UC_ERR_OVERFLOW;
switchD_00576221_caseD_11e:
  return uVar6;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                size_t *size)
{
    CPUARMState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_ARM64_REG_V0 && regid <= UC_ARM64_REG_V31) {
        regid += UC_ARM64_REG_Q0 - UC_ARM64_REG_V0;
    }
    if (regid >= UC_ARM64_REG_X0 && regid <= UC_ARM64_REG_X28) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->xregs[regid - UC_ARM64_REG_X0];
    } else if (regid >= UC_ARM64_REG_W0 && regid <= UC_ARM64_REG_W30) {
        CHECK_REG_TYPE(uint32_t);
        *(uint32_t *)value = READ_DWORD(env->xregs[regid - UC_ARM64_REG_W0]);
    } else if (regid >= UC_ARM64_REG_Q0 && regid <= UC_ARM64_REG_Q31) { // FIXME
        CHECK_REG_TYPE(float64[2]);
        float64 *dst = (float64 *)value;
        uint32_t reg_index = regid - UC_ARM64_REG_Q0;
        dst[0] = env->vfp.zregs[reg_index].d[0];
        dst[1] = env->vfp.zregs[reg_index].d[1];
    } else if (regid >= UC_ARM64_REG_D0 && regid <= UC_ARM64_REG_D31) {
        CHECK_REG_TYPE(float64);
        *(float64 *)value = env->vfp.zregs[regid - UC_ARM64_REG_D0].d[0];
    } else if (regid >= UC_ARM64_REG_S0 && regid <= UC_ARM64_REG_S31) {
        CHECK_REG_TYPE(int32_t);
        *(int32_t *)value =
            READ_DWORD(env->vfp.zregs[regid - UC_ARM64_REG_S0].d[0]);
    } else if (regid >= UC_ARM64_REG_H0 && regid <= UC_ARM64_REG_H31) {
        CHECK_REG_TYPE(int16_t);
        *(int16_t *)value =
            READ_WORD(env->vfp.zregs[regid - UC_ARM64_REG_H0].d[0]);
    } else if (regid >= UC_ARM64_REG_B0 && regid <= UC_ARM64_REG_B31) {
        CHECK_REG_TYPE(int8_t);
        *(int8_t *)value =
            READ_BYTE_L(env->vfp.zregs[regid - UC_ARM64_REG_B0].d[0]);
    } else if (regid >= UC_ARM64_REG_ELR_EL0 && regid <= UC_ARM64_REG_ELR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->elr_el[regid - UC_ARM64_REG_ELR_EL0];
    } else if (regid >= UC_ARM64_REG_SP_EL0 && regid <= UC_ARM64_REG_SP_EL3) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->sp_el[regid - UC_ARM64_REG_SP_EL0];
    } else if (regid >= UC_ARM64_REG_ESR_EL0 && regid <= UC_ARM64_REG_ESR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->cp15.esr_el[regid - UC_ARM64_REG_ESR_EL0];
    } else if (regid >= UC_ARM64_REG_FAR_EL0 && regid <= UC_ARM64_REG_FAR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->cp15.far_el[regid - UC_ARM64_REG_FAR_EL0];
    } else if (regid >= UC_ARM64_REG_VBAR_EL0 &&
               regid <= UC_ARM64_REG_VBAR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->cp15.vbar_el[regid - UC_ARM64_REG_VBAR_EL0];
    } else {
        switch (regid) {
        default:
            break;
        case UC_ARM64_REG_CPACR_EL1:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = env->cp15.cpacr_el1;
            break;
        case UC_ARM64_REG_TPIDR_EL0:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.tpidr_el[0];
            break;
        case UC_ARM64_REG_TPIDRRO_EL0:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.tpidrro_el[0];
            break;
        case UC_ARM64_REG_TPIDR_EL1:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.tpidr_el[1];
            break;
        case UC_ARM64_REG_X29:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->xregs[29];
            break;
        case UC_ARM64_REG_X30:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->xregs[30];
            break;
        case UC_ARM64_REG_PC:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->pc;
            break;
        case UC_ARM64_REG_SP:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->xregs[31];
            break;
        case UC_ARM64_REG_NZCV:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = cpsr_read(env) & CPSR_NZCV;
            break;
        case UC_ARM64_REG_PSTATE:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = pstate_read(env);
            break;
        case UC_ARM64_REG_TTBR0_EL1:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.ttbr0_el[1];
            break;
        case UC_ARM64_REG_TTBR1_EL1:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.ttbr1_el[1];
            break;
        case UC_ARM64_REG_PAR_EL1:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.par_el[1];
            break;
        case UC_ARM64_REG_MAIR_EL1:
            CHECK_REG_TYPE(uint64_t);
            *(uint64_t *)value = env->cp15.mair_el[1];
            break;
        case UC_ARM64_REG_CP_REG:
            CHECK_REG_TYPE(uc_arm64_cp_reg);
            ret = read_cp_reg(env, (uc_arm64_cp_reg *)value);
            break;
        case UC_ARM64_REG_FPCR:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = vfp_get_fpcr(env);
            break;
        case UC_ARM64_REG_FPSR:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = vfp_get_fpsr(env);
            break;
        }
    }

    return ret;
}